

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int ParseCommandLine(Config *config,char **unicode_argv)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined4 uVar6;
  long in_RSI;
  int *in_RDI;
  int version;
  FeatureArg *arg;
  char **wargv;
  char **argv;
  int argc;
  int ok;
  int feature_arg_index;
  int i;
  int local_4c;
  long local_48;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  iVar1 = *in_RDI;
  lVar2 = *(long *)(in_RDI + 2);
  local_48 = lVar2;
  if (in_RSI != 0) {
    local_48 = in_RSI + 8;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                if (iVar1 <= local_14) {
                  return 1;
                }
                puVar5 = (undefined4 *)(*(long *)(in_RDI + 0x12) + (long)local_18 * 0x18);
                if (**(char **)(lVar2 + (long)local_14 * 8) == '-') break;
                if (in_RDI[10] == 0) {
                  fprintf(_stderr,"ERROR: Action must be specified before other arguments.\n");
                  return 0;
                }
                iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"icc");
                if (((iVar3 == 0) ||
                    (iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"exif"), iVar3 == 0)) ||
                   (iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"xmp"), iVar3 == 0)) {
                  if (in_RDI[0x10] != 0) {
                    fprintf(_stderr,"ERROR: Multiple features specified.\n");
                    return 0;
                  }
                  iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"icc");
                  if (iVar3 == 0) {
                    local_4c = 3;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"exif");
                    local_4c = 2;
                    if (iVar3 == 0) {
                      local_4c = 1;
                    }
                  }
                  in_RDI[0x10] = local_4c;
                  if (in_RDI[10] == 2) {
                    if (iVar1 < local_14 + 2) {
                      fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                              *(undefined8 *)(lVar2 + (long)local_14 * 8));
                      return 1;
                    }
                    *(undefined8 *)(puVar5 + 2) =
                         *(undefined8 *)(local_48 + (long)(local_14 + 1) * 8);
                    local_18 = local_18 + 1;
                    local_14 = local_14 + 2;
                  }
                  else {
                    local_14 = local_14 + 1;
                  }
                }
                else {
                  iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"frame");
                  if ((iVar3 == 0) && (in_RDI[10] == 1)) {
                    if (iVar1 < local_14 + 2) {
                      fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                              *(undefined8 *)(lVar2 + (long)local_14 * 8));
                      return 1;
                    }
                    in_RDI[0x10] = 4;
                    *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8);
                    local_18 = local_18 + 1;
                    local_14 = local_14 + 2;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"loop");
                    if ((iVar3 == 0) && (in_RDI[10] == 2)) {
                      if (iVar1 < local_14 + 2) {
                        fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                                *(undefined8 *)(lVar2 + (long)local_14 * 8));
                        return 1;
                      }
                      in_RDI[0x10] = 6;
                      *(undefined8 *)(puVar5 + 4) =
                           *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8);
                      local_18 = local_18 + 1;
                      local_14 = local_14 + 2;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"bgcolor");
                      if ((iVar3 == 0) && (in_RDI[10] == 2)) {
                        if (iVar1 < local_14 + 2) {
                          fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
                          return 1;
                        }
                        in_RDI[0x10] = 7;
                        *(undefined8 *)(puVar5 + 4) =
                             *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8);
                        local_18 = local_18 + 1;
                        local_14 = local_14 + 2;
                      }
                      else {
                        if (*(long *)(in_RDI + 0xc) != 0) {
                          fprintf(_stderr,"ERROR at \'%s\': Multiple input files specified.\n",
                                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
                          return 0;
                        }
                        *(undefined8 *)(in_RDI + 0xc) =
                             *(undefined8 *)(local_48 + (long)local_14 * 8);
                        local_14 = local_14 + 1;
                      }
                    }
                  }
                }
              }
              iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-set");
              if (iVar3 != 0) break;
              if (in_RDI[10] != 0) {
                fprintf(_stderr,"ERROR: Multiple actions specified.\n");
                return 0;
              }
              in_RDI[10] = 2;
              local_14 = local_14 + 1;
            }
            iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-duration");
            if (iVar3 != 0) break;
            if (iVar1 < local_14 + 2) {
              fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                      *(undefined8 *)(lVar2 + (long)local_14 * 8));
              return 1;
            }
            if ((in_RDI[10] != 0) && (in_RDI[10] != 6)) {
              fprintf(_stderr,"ERROR: Multiple actions specified.\n");
              return 0;
            }
            in_RDI[10] = 6;
            if ((in_RDI[0x10] != 0) && (in_RDI[0x10] != 5)) {
              fprintf(_stderr,"ERROR: Multiple features specified.\n");
              return 0;
            }
            in_RDI[0x10] = 5;
            *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8);
            local_18 = local_18 + 1;
            local_14 = local_14 + 2;
          }
          iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-get");
          if (iVar3 != 0) break;
          if (in_RDI[10] != 0) {
            fprintf(_stderr,"ERROR: Multiple actions specified.\n");
            return 0;
          }
          in_RDI[10] = 1;
          local_14 = local_14 + 1;
        }
        iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-strip");
        if (iVar3 != 0) break;
        if (in_RDI[10] != 0) {
          fprintf(_stderr,"ERROR: Multiple actions specified.\n");
          return 0;
        }
        in_RDI[10] = 3;
        in_RDI[0x14] = 0;
        local_14 = local_14 + 1;
      }
      iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-frame");
      if (iVar3 != 0) break;
      if (iVar1 < local_14 + 3) {
        fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                *(undefined8 *)(lVar2 + (long)local_14 * 8));
        return 1;
      }
      if ((in_RDI[10] != 0) && (in_RDI[10] != 2)) {
        fprintf(_stderr,"ERROR: Multiple actions specified.\n");
        return 0;
      }
      in_RDI[10] = 2;
      if ((in_RDI[0x10] != 0) && (in_RDI[0x10] != 4)) {
        fprintf(_stderr,"ERROR: Multiple features specified.\n");
        return 0;
      }
      in_RDI[0x10] = 4;
      *puVar5 = 1;
      *(undefined8 *)(puVar5 + 2) = *(undefined8 *)(local_48 + (long)(local_14 + 1) * 8);
      *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(lVar2 + (long)(local_14 + 2) * 8);
      local_18 = local_18 + 1;
      local_14 = local_14 + 3;
    }
    iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-loop");
    if ((iVar3 == 0) ||
       (iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-bgcolor"), iVar3 == 0)) {
      if (iVar1 < local_14 + 2) {
        fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                *(undefined8 *)(lVar2 + (long)local_14 * 8));
        return 1;
      }
      if ((in_RDI[10] != 0) && (in_RDI[10] != 2)) {
        fprintf(_stderr,"ERROR: Multiple actions specified.\n");
        return 0;
      }
      in_RDI[10] = 2;
      if ((in_RDI[0x10] != 0) && (in_RDI[0x10] != 4)) {
        fprintf(_stderr,"ERROR: Multiple features specified.\n");
        return 0;
      }
      in_RDI[0x10] = 4;
      iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-loop");
      uVar6 = 3;
      if (iVar3 == 0) {
        uVar6 = 2;
      }
      *puVar5 = uVar6;
      *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8);
      local_18 = local_18 + 1;
    }
    else {
      iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-o");
      if (iVar3 == 0) {
        if (iVar1 < local_14 + 2) {
          fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
          return 1;
        }
        *(undefined8 *)(in_RDI + 0xe) = *(undefined8 *)(local_48 + (long)(local_14 + 1) * 8);
      }
      else {
        iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-info");
        if (iVar3 != 0) {
          iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-h");
          if ((iVar3 == 0) ||
             (iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-help"), iVar3 == 0)) {
            PrintHelp();
            DeleteConfig((Config *)0x10457f);
            exit(0);
          }
          iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"-version");
          if (iVar3 == 0) {
            uVar4 = WebPGetMuxVersion();
            printf("%d.%d.%d\n",(ulong)((int)uVar4 >> 0x10 & 0xff),(ulong)((int)uVar4 >> 8 & 0xff),
                   (ulong)(uVar4 & 0xff));
            DeleteConfig((Config *)0x1045ea);
            exit(0);
          }
          iVar3 = strcmp(*(char **)(lVar2 + (long)local_14 * 8),"--");
          if (iVar3 == 0) {
            if (iVar1 + -1 <= local_14) {
              return 1;
            }
            if (*(long *)(in_RDI + 0xc) == 0) {
              *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(local_48 + (long)(local_14 + 1) * 8);
              return 1;
            }
            fprintf(_stderr,"ERROR at \'%s\': Multiple input files specified.\n",
                    *(undefined8 *)(lVar2 + (long)(local_14 + 1) * 8));
            return 0;
          }
          fprintf(_stderr,"ERROR: Unknown option: \'%s\'.\n",
                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
          return 0;
        }
        if (iVar1 < local_14 + 2) {
          fprintf(_stderr,"ERROR: Too few arguments for \'%s\'.\n",
                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
          return 1;
        }
        if (local_14 + 2 < iVar1) {
          fprintf(_stderr,"ERROR: Too many arguments for \'%s\'.\n",
                  *(undefined8 *)(lVar2 + (long)local_14 * 8));
          return 1;
        }
        if (in_RDI[10] != 0) {
          fprintf(_stderr,"ERROR: Multiple actions specified.\n");
          return 0;
        }
        in_RDI[10] = 4;
        in_RDI[0x14] = 0;
        *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(local_48 + (long)(local_14 + 1) * 8);
      }
    }
    local_14 = local_14 + 2;
  } while( true );
}

Assistant:

static int ParseCommandLine(Config* config, const W_CHAR** const unicode_argv) {
  int i = 0;
  int feature_arg_index = 0;
  int ok = 1;
  int argc = config->cmd_args.argc;
  const char* const* argv = config->cmd_args.argv;
  // Unicode file paths will be used if available.
  const char* const* wargv =
      (unicode_argv != NULL) ? (const char**)(unicode_argv + 1) : argv;

  while (i < argc) {
    FeatureArg* const arg = &config->args[feature_arg_index];
    if (argv[i][0] == '-') {  // One of the action types or output.
      if (!strcmp(argv[i], "-set")) {
        if (ACTION_IS_NIL) {
          config->action_type = ACTION_SET;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        ++i;
      } else if (!strcmp(argv[i], "-duration")) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        if (ACTION_IS_NIL || config->action_type == ACTION_DURATION) {
          config->action_type = ACTION_DURATION;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        if (FEATURETYPE_IS_NIL || config->type == FEATURE_DURATION) {
          config->type = FEATURE_DURATION;
        } else {
          ERROR_GOTO1("ERROR: Multiple features specified.\n", ErrParse);
        }
        arg->params = argv[i + 1];
        ++feature_arg_index;
        i += 2;
      } else if (!strcmp(argv[i], "-get")) {
        if (ACTION_IS_NIL) {
          config->action_type = ACTION_GET;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        ++i;
      } else if (!strcmp(argv[i], "-strip")) {
        if (ACTION_IS_NIL) {
          config->action_type = ACTION_STRIP;
          config->arg_count = 0;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        ++i;
      } else if (!strcmp(argv[i], "-frame")) {
        CHECK_NUM_ARGS_AT_LEAST(3, ErrParse);
        if (ACTION_IS_NIL || config->action_type == ACTION_SET) {
          config->action_type = ACTION_SET;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        if (FEATURETYPE_IS_NIL || config->type == FEATURE_ANMF) {
          config->type = FEATURE_ANMF;
        } else {
          ERROR_GOTO1("ERROR: Multiple features specified.\n", ErrParse);
        }
        arg->subtype = SUBTYPE_ANMF;
        arg->filename = wargv[i + 1];
        arg->params = argv[i + 2];
        ++feature_arg_index;
        i += 3;
      } else if (!strcmp(argv[i], "-loop") || !strcmp(argv[i], "-bgcolor")) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        if (ACTION_IS_NIL || config->action_type == ACTION_SET) {
          config->action_type = ACTION_SET;
        } else {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        }
        if (FEATURETYPE_IS_NIL || config->type == FEATURE_ANMF) {
          config->type = FEATURE_ANMF;
        } else {
          ERROR_GOTO1("ERROR: Multiple features specified.\n", ErrParse);
        }
        arg->subtype =
            !strcmp(argv[i], "-loop") ? SUBTYPE_LOOP : SUBTYPE_BGCOLOR;
        arg->params = argv[i + 1];
        ++feature_arg_index;
        i += 2;
      } else if (!strcmp(argv[i], "-o")) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        config->output = wargv[i + 1];
        i += 2;
      } else if (!strcmp(argv[i], "-info")) {
        CHECK_NUM_ARGS_EXACTLY(2, ErrParse);
        if (config->action_type != NIL_ACTION) {
          ERROR_GOTO1("ERROR: Multiple actions specified.\n", ErrParse);
        } else {
          config->action_type = ACTION_INFO;
          config->arg_count = 0;
          config->input = wargv[i + 1];
        }
        i += 2;
      } else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "-help")) {
        PrintHelp();
        DeleteConfig(config);
        LOCAL_FREE((W_CHAR** const)unicode_argv);
        exit(0);
      } else if (!strcmp(argv[i], "-version")) {
        const int version = WebPGetMuxVersion();
        printf("%d.%d.%d\n",
               (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
        DeleteConfig(config);
        LOCAL_FREE((W_CHAR** const)unicode_argv);
        exit(0);
      } else if (!strcmp(argv[i], "--")) {
        if (i < argc - 1) {
          ++i;
          if (config->input == NULL) {
            config->input = wargv[i];
          } else {
            ERROR_GOTO2("ERROR at '%s': Multiple input files specified.\n",
                        argv[i], ErrParse);
          }
        }
        break;
      } else {
        ERROR_GOTO2("ERROR: Unknown option: '%s'.\n", argv[i], ErrParse);
      }
    } else {  // One of the feature types or input.
      if (ACTION_IS_NIL) {
        ERROR_GOTO1("ERROR: Action must be specified before other arguments.\n",
                    ErrParse);
      }
      if (!strcmp(argv[i], "icc") || !strcmp(argv[i], "exif") ||
          !strcmp(argv[i], "xmp")) {
        if (FEATURETYPE_IS_NIL) {
          config->type = (!strcmp(argv[i], "icc")) ? FEATURE_ICCP :
              (!strcmp(argv[i], "exif")) ? FEATURE_EXIF : FEATURE_XMP;
        } else {
          ERROR_GOTO1("ERROR: Multiple features specified.\n", ErrParse);
        }
        if (config->action_type == ACTION_SET) {
          CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
          arg->filename = wargv[i + 1];
          ++feature_arg_index;
          i += 2;
        } else {
          ++i;
        }
      } else if (!strcmp(argv[i], "frame") &&
                 (config->action_type == ACTION_GET)) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        config->type = FEATURE_ANMF;
        arg->params = argv[i + 1];
        ++feature_arg_index;
        i += 2;
      } else if (!strcmp(argv[i], "loop") &&
                 (config->action_type == ACTION_SET)) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        config->type = FEATURE_LOOP;
        arg->params = argv[i + 1];
        ++feature_arg_index;
        i += 2;
      } else if (!strcmp(argv[i], "bgcolor") &&
                 (config->action_type == ACTION_SET)) {
        CHECK_NUM_ARGS_AT_LEAST(2, ErrParse);
        config->type = FEATURE_BGCOLOR;
        arg->params = argv[i + 1];
        ++feature_arg_index;
        i += 2;
      } else {  // Assume input file.
        if (config->input == NULL) {
          config->input = wargv[i];
        } else {
          ERROR_GOTO2("ERROR at '%s': Multiple input files specified.\n",
                      argv[i], ErrParse);
        }
        ++i;
      }
    }
  }
 ErrParse:
  return ok;
}